

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian_misc.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLaplacian::compGrad(MLNodeLaplacian *this,int amrlev,MultiFab *grad,MultiFab *sol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  FabType FVar16;
  long lVar17;
  int *piVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  void *__s;
  long lVar33;
  long lVar34;
  uint uVar35;
  bool bVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  MFIter mfi;
  int local_2b4;
  long local_2a0;
  uint local_298;
  int local_288;
  Box local_25c;
  FabArray<amrex::FArrayBox> *local_240;
  FabArray<amrex::EBCellFlagFab> *local_238;
  long local_230;
  long local_228;
  ulong local_220;
  long local_218;
  int local_210;
  int local_20c;
  double local_208;
  double local_200;
  double local_1f8;
  FabArray<amrex::FArrayBox> *local_1f0;
  Array4<double> local_1e8;
  __uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  FabArray<amrex::FArrayBox> *local_188;
  ulong local_180;
  long local_178;
  long local_170;
  ulong local_168;
  double *local_160;
  long local_158;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  lVar17 = *(long *)&(this->super_MLNodeLinOp).super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  local_1f8 = *(double *)(lVar17 + 0x38);
  local_200 = *(double *)(lVar17 + 0x40);
  local_208 = *(double *)(lVar17 + 0x48);
  lVar17 = **(long **)&(this->super_MLNodeLinOp).super_MLLinOp.m_factory.
                       super_vector<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       .
                       super__Vector_base<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[amrlev].
                       super_vector<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>,_std::allocator<std::unique_ptr<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>_>_>
  ;
  bVar11 = true;
  local_1f0 = &grad->super_FabArray<amrex::FArrayBox>;
  local_188 = &sol->super_FabArray<amrex::FArrayBox>;
  if (lVar17 == 0) {
    local_238 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    local_240 = (FabArray<amrex::FArrayBox> *)0x0;
  }
  else {
    local_238 = (FabArray<amrex::EBCellFlagFab> *)0x0;
    lVar17 = __dynamic_cast(lVar17,&FabFactory<amrex::FArrayBox>::typeinfo,
                            &EBFArrayBoxFactory::typeinfo,0);
    local_240 = (FabArray<amrex::FArrayBox> *)0x0;
    if (lVar17 != 0) {
      local_238 = EBDataCollection::getMultiEBCellFlagFab(*(EBDataCollection **)(lVar17 + 0xd8));
      local_240 = &EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar17 + 0xd8))->
                   super_FabArray<amrex::FArrayBox>;
      bVar11 = false;
    }
  }
  local_1a8._M_t.super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl =
       (this->m_integral).
       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
       super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t;
  MFIter::MFIter(&local_90,&local_1f0->super_FabArrayBase,true);
  if (local_90.currentIndex < local_90.endIndex) {
    local_190 = local_1f8 * 0.25;
    local_198 = local_200 * 0.25;
    local_1a0 = local_208 * 0.25;
    do {
      MFIter::tilebox(&local_25c,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_1e8,local_1f0,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_150,local_188,&local_90);
      iVar13 = local_25c.bigend.vect[2];
      iVar12 = local_25c.bigend.vect[1];
      uVar35 = local_25c.bigend.vect[0];
      iVar24 = local_25c.smallend.vect[2];
      iVar10 = local_25c.smallend.vect[1];
      iVar9 = local_25c.smallend.vect[0];
      lVar20 = (long)local_25c.smallend.vect[0];
      local_288 = local_25c.smallend.vect[0];
      local_298 = local_25c.bigend.vect[1];
      local_2b4 = local_25c.bigend.vect[2];
      lVar25 = (long)local_25c.smallend.vect[1];
      uVar14 = local_25c.bigend.vect[0] - local_25c.smallend.vect[0];
      iVar15 = local_25c.bigend.vect[1] - local_25c.smallend.vect[1];
      local_2a0 = 0;
      lVar17 = 0;
      do {
        iVar22 = iVar24;
        if (iVar24 <= iVar13) {
          do {
            if (iVar10 <= iVar12) {
              lVar34 = local_1e8.jstride * 8;
              __s = (void *)((long)local_1e8.p +
                            local_1e8.nstride * local_2a0 +
                            (lVar25 - local_1e8.begin.y) * lVar34 +
                            (iVar22 - local_1e8.begin.z) * local_1e8.kstride * 8 +
                            (long)local_1e8.begin.x * -8 + lVar20 * 8);
              iVar23 = iVar15 + 1;
              do {
                if (iVar9 <= (int)uVar35) {
                  memset(__s,0,(ulong)uVar14 * 8 + 8);
                }
                __s = (void *)((long)__s + lVar34);
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
            }
            bVar36 = iVar22 != iVar13;
            iVar22 = iVar22 + 1;
          } while (bVar36);
        }
        lVar17 = lVar17 + 1;
        local_2a0 = local_2a0 + 8;
      } while (lVar17 != 3);
      if (bVar11) {
LAB_005c4263:
        if (iVar24 <= local_2b4) {
          local_228 = (long)iVar10;
          local_230 = (long)local_288 * 8;
          do {
            if (iVar10 <= (int)local_298) {
              lVar25 = (long)local_1e8.begin.x;
              lVar34 = (iVar24 - local_1e8.begin.z) * local_1e8.kstride;
              lVar21 = (long)((iVar24 + 1) - local_150.begin.z) * local_150.kstride * 8 +
                       (long)local_150.begin.x * -8;
              local_218 = (long)local_150.p + lVar21 + local_230 + 8;
              lVar20 = local_150.kstride * 8 * (long)(iVar24 - local_150.begin.z) +
                       (long)local_150.begin.x * -8;
              local_220 = (long)local_150.p + lVar20 + local_230 + 8;
              lVar17 = local_228;
              do {
                iVar9 = (int)lVar17;
                if (local_288 <= (int)uVar35) {
                  lVar28 = (lVar17 - local_1e8.begin.y) * local_1e8.jstride * 8;
                  lVar26 = lVar28 + lVar34 * 8 + lVar25 * -8 + local_230;
                  lVar27 = lVar28 + local_1e8.nstride * 8 + lVar34 * 8 + lVar25 * -8 + local_230;
                  lVar28 = lVar28 + local_1e8.nstride * 0x10 + lVar34 * 8 + lVar25 * -8 + local_230;
                  lVar32 = (lVar17 - local_150.begin.y) * local_150.jstride * 8;
                  lVar30 = local_218 + lVar32;
                  lVar32 = lVar32 + local_220;
                  lVar33 = (long)((iVar9 + 1) - local_150.begin.y) * local_150.jstride * 8;
                  lVar29 = lVar33 + lVar21 + local_230;
                  lVar33 = lVar33 + lVar20 + local_230;
                  lVar31 = 0;
                  do {
                    *(double *)((long)local_1e8.p + lVar31 * 8 + lVar26) =
                         (((((((*(double *)(lVar32 + lVar31 * 8) -
                               *(double *)(lVar32 + -8 + lVar31 * 8)) -
                              *(double *)((long)local_150.p + lVar31 * 8 + lVar33)) +
                             *(double *)((long)local_150.p + lVar31 * 8 + lVar33 + 8)) -
                            *(double *)(lVar30 + -8 + lVar31 * 8)) +
                           *(double *)(lVar30 + lVar31 * 8)) -
                          *(double *)((long)local_150.p + lVar31 * 8 + lVar29)) +
                         *(double *)((long)local_150.p + lVar31 * 8 + lVar29 + 8)) * local_190 +
                         *(double *)((long)local_1e8.p + lVar31 * 8 + lVar26);
                    *(double *)((long)local_1e8.p + lVar31 * 8 + lVar27) =
                         (((((-*(double *)(lVar32 + -8 + lVar31 * 8) -
                             *(double *)(lVar32 + lVar31 * 8)) +
                             *(double *)((long)local_150.p + lVar31 * 8 + lVar33) +
                            *(double *)((long)local_150.p + lVar31 * 8 + lVar33 + 8)) -
                           *(double *)(lVar30 + -8 + lVar31 * 8)) - *(double *)(lVar30 + lVar31 * 8)
                          ) + *(double *)((long)local_150.p + lVar31 * 8 + lVar29) +
                         *(double *)((long)local_150.p + lVar31 * 8 + lVar29 + 8)) * local_198 +
                         *(double *)((long)local_1e8.p + lVar31 * 8 + lVar27);
                    *(double *)((long)local_1e8.p + lVar31 * 8 + lVar28) =
                         ((((-*(double *)(lVar32 + -8 + lVar31 * 8) -
                            *(double *)(lVar32 + lVar31 * 8)) -
                           *(double *)((long)local_150.p + lVar31 * 8 + lVar33)) -
                          *(double *)((long)local_150.p + lVar31 * 8 + lVar33 + 8)) +
                          *(double *)(lVar30 + -8 + lVar31 * 8) + *(double *)(lVar30 + lVar31 * 8) +
                          *(double *)((long)local_150.p + lVar31 * 8 + lVar29) +
                         *(double *)((long)local_150.p + lVar31 * 8 + lVar29 + 8)) * local_1a0 +
                         *(double *)((long)local_1e8.p + lVar31 * 8 + lVar28);
                    lVar31 = lVar31 + 1;
                  } while ((uVar35 - local_288) + 1 != (int)lVar31);
                }
                lVar17 = lVar17 + 1;
              } while (iVar9 + 1 != local_298 + 1);
            }
            iVar24 = iVar24 + 1;
          } while (iVar24 != local_2b4 + 1);
        }
      }
      else {
        piVar18 = &local_90.currentIndex;
        if (local_90.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
          piVar18 = ((local_90.local_index_map)->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start + local_90.currentIndex;
        }
        FVar16 = EBCellFlagFab::getType
                           ((local_238->m_fabs_v).
                            super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[*piVar18],&local_25c);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_d0,local_240,&local_90);
        FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&local_110,
                   (FabArray<amrex::FArrayBox> *)
                   local_1a8._M_t.
                   super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                   super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl,&local_90);
        if (FVar16 != covered) {
          if (FVar16 != singlevalued) {
            local_288 = local_25c.smallend.vect[0];
            local_298 = local_25c.bigend.vect[1];
            local_2b4 = local_25c.bigend.vect[2];
            uVar35 = local_25c.bigend.vect[0];
            iVar10 = local_25c.smallend.vect[1];
            iVar24 = local_25c.smallend.vect[2];
            goto LAB_005c4263;
          }
          if (local_25c.smallend.vect[2] <= local_25c.bigend.vect[2]) {
            local_168 = (ulong)(uint)local_25c.bigend.vect[0];
            local_180 = (ulong)(uint)local_25c.bigend.vect[1];
            local_170 = (long)local_25c.smallend.vect[1];
            local_178 = (long)local_25c.smallend.vect[0];
            local_20c = local_25c.bigend.vect[1] + 1;
            local_210 = local_25c.bigend.vect[2] + 1;
            iVar24 = local_25c.smallend.vect[2];
            do {
              if (local_25c.smallend.vect[1] <= local_25c.bigend.vect[1]) {
                local_228 = (long)local_d0.begin.y;
                local_230 = local_d0.jstride;
                local_158 = (long)iVar24;
                local_160 = local_d0.p + (local_158 - local_d0.begin.z) * local_d0.kstride;
                lVar17 = local_170;
                do {
                  if (local_25c.bigend.vect[0] < local_25c.smallend.vect[0]) {
                    uVar19 = lVar17 + 1U & 0xffffffff;
                  }
                  else {
                    lVar26 = (lVar17 - local_150.begin.y) * local_150.jstride;
                    lVar25 = (iVar24 - local_150.begin.z) * local_150.kstride;
                    uVar19 = lVar17 + 1;
                    lVar34 = ((int)uVar19 - local_150.begin.y) * local_150.jstride;
                    lVar33 = ((iVar24 + 1) - local_150.begin.z) * local_150.kstride;
                    lVar27 = (lVar17 - local_110.begin.y) * local_110.jstride;
                    lVar28 = (local_158 - local_110.begin.z) * local_110.kstride;
                    lVar21 = (lVar17 - local_1e8.begin.y) * local_1e8.jstride;
                    lVar29 = (local_158 - local_1e8.begin.z) * local_1e8.kstride;
                    local_218 = local_110.nstride * 0x30;
                    lVar20 = local_178;
                    do {
                      dVar37 = local_160[(lVar17 - local_228) * local_d0.jstride +
                                         (lVar20 - local_d0.begin.x)];
                      iVar10 = (int)lVar20;
                      if ((dVar37 != 0.0) || (NAN(dVar37))) {
                        lVar30 = lVar20 - local_150.begin.x;
                        dVar1 = local_150.p[lVar26 + lVar30 + lVar25];
                        lVar32 = (long)((iVar10 + 1) - local_150.begin.x);
                        dVar2 = local_150.p[lVar26 + lVar30 + lVar33];
                        dVar3 = local_150.p[lVar26 + lVar32 + lVar25];
                        dVar4 = local_150.p[lVar26 + lVar32 + lVar33];
                        dVar5 = local_150.p[lVar34 + lVar30 + lVar25];
                        dVar6 = local_150.p[lVar34 + lVar32 + lVar25];
                        dVar7 = local_150.p[lVar34 + lVar30 + lVar33];
                        dVar8 = local_150.p[lVar34 + lVar32 + lVar33];
                        dVar38 = ((dVar8 - dVar7) - dVar4) + dVar2;
                        dVar40 = ((((dVar6 + dVar38) - dVar5) - dVar3) + dVar1) / dVar37;
                        dVar39 = ((((((dVar4 + (dVar8 - dVar7)) - dVar2) - dVar6) + dVar5) - dVar3)
                                 + dVar1) / dVar37;
                        dVar38 = (((dVar38 - dVar6) + dVar5 + dVar3) - dVar1) / dVar37;
                        lVar32 = lVar20 - local_110.begin.x;
                        lVar30 = lVar20 - local_1e8.begin.x;
                        dVar37 = ((((((dVar7 + dVar8) - dVar4) - dVar2) - dVar6) - dVar5) + dVar3 +
                                 dVar1) / dVar37;
                        local_1e8.p[lVar21 + lVar29 + lVar30] =
                             (local_110.p[lVar27 + lVar28 + lVar32 + local_110.nstride * 8] * dVar38
                             + local_110.p[lVar27 + lVar28 + lVar32 + local_110.nstride * 2] * 0.5 *
                               dVar39 + local_110.p[lVar27 + lVar28 + lVar32 + local_110.nstride] *
                                        0.5 * dVar40 +
                                        (((((((dVar3 - dVar1) - dVar5) + dVar6) - dVar2) + dVar4) -
                                         dVar7) + dVar8) * 0.25) * local_1f8 +
                             local_1e8.p[lVar21 + lVar29 + lVar30];
                        local_1e8.p[lVar21 + lVar29 + lVar30 + local_1e8.nstride] =
                             (local_110.p[lVar27 + lVar28 + lVar32 + local_110.nstride * 7] * dVar38
                             + local_110.p[lVar27 + lVar28 + lVar32 + local_110.nstride * 2] * 0.5 *
                               dVar37 + local_110.p[lVar27 + lVar28 + lVar32] * 0.5 * dVar40 +
                                        (((((-dVar1 - dVar3) + dVar5 + dVar6) - dVar2) - dVar4) +
                                         dVar7 + dVar8) * 0.25) * local_200 +
                             local_1e8.p[lVar21 + lVar29 + lVar30 + local_1e8.nstride];
                        local_1e8.p[lVar21 + lVar29 + lVar30 + local_1e8.nstride * 2] =
                             (dVar38 * local_110.p[lVar27 + lVar28 + lVar32 + local_110.nstride * 6]
                             + local_110.p[lVar27 + lVar28 + lVar32 + local_110.nstride] * 0.5 *
                               dVar37 + local_110.p[lVar27 + lVar28 + lVar32] * 0.5 * dVar39 +
                                        ((((-dVar1 - dVar3) - dVar5) - dVar6) + dVar2 + dVar4 +
                                         dVar7 + dVar8) * 0.25) * local_208 +
                             local_1e8.p[lVar21 + lVar29 + lVar30 + local_1e8.nstride * 2];
                      }
                      else {
                        lVar30 = lVar20 - local_1e8.begin.x;
                        local_1e8.p[lVar21 + lVar29 + lVar30 + local_1e8.nstride * 2] = 0.0;
                        local_1e8.p[lVar21 + lVar29 + lVar30 + local_1e8.nstride] = 0.0;
                        local_1e8.p[lVar21 + lVar29 + lVar30] = 0.0;
                      }
                      lVar20 = lVar20 + 1;
                      local_220 = uVar19;
                    } while (iVar10 + 1 != local_25c.bigend.vect[0] + 1U);
                  }
                  lVar17 = lVar17 + 1;
                } while ((int)uVar19 != local_20c);
              }
              iVar24 = iVar24 + 1;
            } while (iVar24 != local_210);
          }
        }
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLNodeLaplacian::compGrad (int amrlev, MultiFab& grad, MultiFab& sol) const
{
#if (AMREX_SPACEDIM == 2)
    bool is_rz = m_is_rz;
#endif

    Real sigma = Real(-1.0);

    AMREX_ASSERT(grad.nComp() >= AMREX_SPACEDIM);

    const auto dxinv = m_geom[amrlev][0].InvCellSizeArray();
#ifdef AMREX_USE_EB
    auto factory = dynamic_cast<EBFArrayBoxFactory const*>(m_factory[amrlev][0].get());
    const FabArray<EBCellFlagFab>* flags = (factory) ? &(factory->getMultiEBCellFlagFab()) : nullptr;
    const MultiFab* vfrac = (factory) ? &(factory->getVolFrac()) : nullptr;
    const MultiFab* intg = m_integral[amrlev].get();
#endif

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(grad, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& garr = grad.array(mfi);
        Array4<Real const> const& solarr = sol.const_array(mfi);

        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, AMREX_SPACEDIM, i, j, k, n,
        {
            garr(i,j,k,n) = 0.0;
        });

#ifdef AMREX_USE_EB
        bool regular = !factory;
        if (factory)
        {
            auto type = (*flags)[mfi].getType(bx);
            Array4<Real const> const& vfracarr = vfrac->const_array(mfi);
            Array4<Real const> const& intgarr = intg->const_array(mfi);
            if (type == FabType::covered)
            { }
            else if (type == FabType::singlevalued)
            {
              AMREX_HOST_DEVICE_FOR_3D(bx, i, j, k,
              {
                  mlndlap_mknewu_eb_c(i,j,k, garr, solarr, sigma, vfracarr, intgarr, dxinv);
              });
            }
            else
            {
                regular = true;
            }
        }
        if (regular)
#endif
        {

#if (AMREX_SPACEDIM == 2)
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_mknewu_c(i,j,k,garr,solarr,sigma,dxinv,is_rz);
            });
#else
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D (bx, i, j, k,
            {
                mlndlap_mknewu_c(i,j,k,garr,solarr,sigma,dxinv);
            });
#endif
        }
    }
}